

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::TypeSpecializeFloatDst
          (GlobOpt *this,Instr *instr,Value *valToTransfer,Value *src1Value,Value *src2Value,
          Value **pDstVal)

{
  code *pcVar1;
  bool bVar2;
  Opnd *this_00;
  undefined4 *puVar3;
  RegOpnd *dst_00;
  Value *pVVar4;
  GlobOptBlockData *this_01;
  Opnd *dst;
  Value **pDstVal_local;
  Value *src2Value_local;
  Value *src1Value_local;
  Value *valToTransfer_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  this_00 = IR::Instr::GetDst(instr);
  if (this_00 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x299c,"(dst)","dst");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = IR::Opnd::IsRegOpnd(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x299e,"(dst->IsRegOpnd())","What else?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  dst_00 = IR::Opnd::AsRegOpnd(this_00);
  ToFloat64Dst(this,instr,dst_00,this->currentBlock);
  if (valToTransfer == (Value *)0x0) {
    pVVar4 = CreateDstUntransferredValue(this,ValueType::Float,instr,src1Value,src2Value);
    *pDstVal = pVVar4;
  }
  else {
    pVVar4 = ValueNumberTransferDst(this,instr,valToTransfer);
    *pDstVal = pVVar4;
    this_01 = CurrentBlockData(this);
    GlobOptBlockData::InsertNewValue(this_01,*pDstVal,this_00);
  }
  return;
}

Assistant:

void
GlobOpt::TypeSpecializeFloatDst(IR::Instr *instr, Value *valToTransfer, Value *const src1Value, Value *const src2Value, Value **pDstVal)
{
    IR::Opnd* dst = instr->GetDst();
    Assert(dst);

    AssertMsg(dst->IsRegOpnd(), "What else?");
    this->ToFloat64Dst(instr, dst->AsRegOpnd(), this->currentBlock);

    if(valToTransfer)
    {
        *pDstVal = this->ValueNumberTransferDst(instr, valToTransfer);
        CurrentBlockData()->InsertNewValue(*pDstVal, dst);
    }
    else
    {
        *pDstVal = CreateDstUntransferredValue(ValueType::Float, instr, src1Value, src2Value);
    }
}